

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O1

bool __thiscall CNetAddr::IsRFC3849(CNetAddr *this)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long in_FS_OFFSET;
  bool bVar6;
  char local_c [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_net == NET_IPV6) {
    local_c[0] = ' ';
    local_c[1] = '\x01';
    local_c[2] = '\r';
    local_c[3] = -0x48;
    uVar3 = (this->m_addr)._size;
    uVar4 = uVar3 - 0x11;
    if (uVar3 < 0x11) {
      uVar4 = uVar3;
    }
    if (3 < uVar4) {
      if (0x10 < uVar3) {
        this = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
      }
      if ((this->m_addr)._union.direct[0] == ' ') {
        lVar5 = 1;
        do {
          bVar6 = lVar5 == 4;
          if (bVar6) goto LAB_00d6e2ff;
          pcVar2 = local_c + lVar5;
          pcVar1 = (this->m_addr)._union.direct + lVar5;
          lVar5 = lVar5 + 1;
        } while (*pcVar2 == *pcVar1);
      }
    }
  }
  bVar6 = false;
LAB_00d6e2ff:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool CNetAddr::IsRFC3849() const
{
    return IsIPv6() && HasPrefix(m_addr, std::array<uint8_t, 4>{0x20, 0x01, 0x0D, 0xB8});
}